

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrule.cpp
# Opt level: O2

void __thiscall
icu_63::NFRule::doFormat
          (NFRule *this,int64_t number,UnicodeString *toInsertInto,int32_t pos,
          int32_t recursionCount,UErrorCode *status)

{
  UnicodeString *srcText;
  short sVar1;
  PluralFormat *this_00;
  NFSubstitution *pNVar2;
  int start;
  int32_t iVar3;
  uint64_t uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  UnicodeString local_70;
  
  srcText = &this->fRuleText;
  if (this->rulePatternFormat == (PluralFormat *)0x0) {
    sVar1 = (this->fRuleText).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      start = (this->fRuleText).fUnion.fFields.fLength;
    }
    else {
      start = (int)sVar1 >> 5;
    }
    UnicodeString::insert(toInsertInto,pos,srcText);
    iVar7 = 0;
  }
  else {
    start = UnicodeString::indexOf(srcText,L"$(",-1,0);
    iVar3 = UnicodeString::indexOf(srcText,L")$",-1,start);
    sVar1 = (toInsertInto->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar5 = (toInsertInto->fUnion).fFields.fLength;
    }
    else {
      iVar5 = (int)sVar1 >> 5;
    }
    sVar1 = (this->fRuleText).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar7 = (this->fRuleText).fUnion.fFields.fLength;
    }
    else {
      iVar7 = (int)sVar1 >> 5;
    }
    if (iVar3 < iVar7 + -1) {
      UnicodeString::tempSubString(&local_70,srcText,iVar3 + 2,0x7fffffff);
      UnicodeString::insert(toInsertInto,pos,&local_70);
      UnicodeString::~UnicodeString(&local_70);
    }
    this_00 = this->rulePatternFormat;
    uVar4 = util64_pow(this->radix,this->exponent);
    PluralFormat::format(&local_70,this_00,(int32_t)((ulong)number / uVar4),status);
    UnicodeString::insert(toInsertInto,pos,&local_70);
    UnicodeString::~UnicodeString(&local_70);
    if (0 < start) {
      UnicodeString::tempSubString(&local_70,srcText,0,start);
      UnicodeString::insert(toInsertInto,pos,&local_70);
      UnicodeString::~UnicodeString(&local_70);
    }
    sVar1 = (this->fRuleText).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar6 = (this->fRuleText).fUnion.fFields.fLength;
    }
    else {
      iVar6 = (int)sVar1 >> 5;
    }
    sVar1 = (toInsertInto->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar7 = (toInsertInto->fUnion).fFields.fLength;
    }
    else {
      iVar7 = (int)sVar1 >> 5;
    }
    iVar7 = (iVar6 + iVar5) - iVar7;
  }
  pNVar2 = this->sub2;
  if (pNVar2 != (NFSubstitution *)0x0) {
    iVar5 = 0;
    if (start < pNVar2->pos) {
      iVar5 = iVar7;
    }
    (*(pNVar2->super_UObject)._vptr_UObject[6])
              (pNVar2,number,toInsertInto,(ulong)(uint)(pos - iVar5),(ulong)(uint)recursionCount,
               status);
  }
  pNVar2 = this->sub1;
  if (pNVar2 != (NFSubstitution *)0x0) {
    iVar5 = 0;
    if (start < pNVar2->pos) {
      iVar5 = iVar7;
    }
    (*(pNVar2->super_UObject)._vptr_UObject[6])
              (pNVar2,number,toInsertInto,(ulong)(uint)(pos - iVar5),(ulong)(uint)recursionCount,
               status);
  }
  return;
}

Assistant:

void
NFRule::doFormat(int64_t number, UnicodeString& toInsertInto, int32_t pos, int32_t recursionCount, UErrorCode& status) const
{
    // first, insert the rule's rule text into toInsertInto at the
    // specified position, then insert the results of the substitutions
    // into the right places in toInsertInto (notice we do the
    // substitutions in reverse order so that the offsets don't get
    // messed up)
    int32_t pluralRuleStart = fRuleText.length();
    int32_t lengthOffset = 0;
    if (!rulePatternFormat) {
        toInsertInto.insert(pos, fRuleText);
    }
    else {
        pluralRuleStart = fRuleText.indexOf(gDollarOpenParenthesis, -1, 0);
        int pluralRuleEnd = fRuleText.indexOf(gClosedParenthesisDollar, -1, pluralRuleStart);
        int initialLength = toInsertInto.length();
        if (pluralRuleEnd < fRuleText.length() - 1) {
            toInsertInto.insert(pos, fRuleText.tempSubString(pluralRuleEnd + 2));
        }
        toInsertInto.insert(pos,
            rulePatternFormat->format((int32_t)(number/util64_pow(radix, exponent)), status));
        if (pluralRuleStart > 0) {
            toInsertInto.insert(pos, fRuleText.tempSubString(0, pluralRuleStart));
        }
        lengthOffset = fRuleText.length() - (toInsertInto.length() - initialLength);
    }

    if (sub2 != NULL) {
        sub2->doSubstitution(number, toInsertInto, pos - (sub2->getPos() > pluralRuleStart ? lengthOffset : 0), recursionCount, status);
    }
    if (sub1 != NULL) {
        sub1->doSubstitution(number, toInsertInto, pos - (sub1->getPos() > pluralRuleStart ? lengthOffset : 0), recursionCount, status);
    }
}